

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.hpp
# Opt level: O0

ostream * detail::operator<<(ostream *os,print_bytes<unsigned_long> *s)

{
  type tVar1;
  streamsize __prec;
  ostream *poVar2;
  ulong *in_RSI;
  ostream *in_RDI;
  bool bVar3;
  streamsize old_precision;
  float num;
  size_t i;
  uint64_t whole;
  size_t frac;
  float local_54;
  float local_4c;
  ulong local_28;
  ulong local_20;
  ulong local_18;
  
  local_18 = (*in_RSI - *in_RSI) * 0x400;
  local_20 = *in_RSI;
  local_28 = 0;
  while( true ) {
    bVar3 = false;
    if (0x3ff < local_20) {
      tVar1 = boost::size<char_const*[9]>((char *(*) [9])0x13a4b4);
      bVar3 = local_28 < tVar1 - 1;
    }
    if (!bVar3) break;
    local_18 = local_20 & 0x3ff;
    local_20 = local_20 >> 10;
    local_28 = local_28 + 1;
  }
  if ((((local_20 < 100) || (3 < (int)in_RSI[1])) && ((local_20 < 10 || (2 < (int)in_RSI[1])))) &&
     (1 < (int)in_RSI[1])) {
    local_4c = (float)local_20;
    local_54 = (float)local_18;
    __prec = std::ios_base::precision
                       ((ios_base *)
                        ((long)&in_RDI->_vptr_basic_ostream + (long)in_RDI->_vptr_basic_ostream[-3])
                        ,(long)(int)in_RSI[1]);
    std::ostream::operator<<(in_RDI,local_4c + local_54 / 1024.0);
    std::ios_base::precision
              ((ios_base *)
               ((long)&in_RDI->_vptr_basic_ostream + (long)in_RDI->_vptr_basic_ostream[-3]),__prec);
  }
  else {
    std::ostream::operator<<(in_RDI,local_20);
  }
  poVar2 = std::operator<<(in_RDI,' ');
  poVar2 = std::operator<<(poVar2,byte_size_units[local_28]);
  return poVar2;
}

Assistant:

std::ostream & operator<<(std::ostream & os, const print_bytes<T> & s) {
	
	size_t frac = size_t(1024 * (s.value - T(boost::uint64_t(s.value))));
	boost::uint64_t whole = boost::uint64_t(s.value);
	
	size_t i = 0;
	
	while(whole >= 1024 && i < size_t(boost::size(byte_size_units)) - 1) {
		frac = whole % 1024, whole /= 1024;
		i++;
	}
	
	if((whole >= 100 && s.precision <= 3) || (whole >= 10 && s.precision <= 2) || s.precision <= 1) {
		os << whole;
	} else {
		float num = float(whole) + (float(frac) / 1024.f);
		std::streamsize old_precision = os.precision(s.precision);
		os << num;
		os.precision(old_precision);
	}
	
	return os << ' ' << byte_size_units[i];
}